

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O0

void __thiscall EmitXml::spaces(EmitXml *this,int4 num,int4 bump)

{
  undefined8 uVar1;
  int local_44;
  string local_40 [4];
  int4 i;
  string spc;
  char *tenspaces;
  int4 bump_local;
  int4 num_local;
  EmitXml *this_local;
  
  if (num < 0xb) {
    (*this->_vptr_EmitXml[0x19])(this,"          " + (10 - num),8);
  }
  else {
    std::__cxx11::string::string(local_40);
    for (local_44 = 0; local_44 < num; local_44 = local_44 + 1) {
      std::__cxx11::string::operator+=(local_40,' ');
    }
    uVar1 = std::__cxx11::string::c_str();
    (*this->_vptr_EmitXml[0x19])(this,uVar1,8);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void EmitXml::spaces(int4 num,int4 bump)

{
  const char *tenspaces = "          ";
  if (num <= 10)
    print(tenspaces+(10-num));
  else {
    string spc;
    for(int4 i=0;i<num;++i)
      spc += ' ';
    print(spc.c_str());
  }
}